

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memops.c
# Opt level: O0

void dmrC_simplify_memops(dmr_C *C,entrypoint *ep)

{
  undefined1 local_50 [8];
  ptr_list_iter bbiter___1;
  ptr_list_iter bbiter__;
  basic_block *bb;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  ptrlist_reverse_iterator((ptr_list_iter *)&bbiter___1.__nr,(ptr_list *)ep->bbs);
  bbiter__._16_8_ = ptrlist_iter_prev((ptr_list_iter *)&bbiter___1.__nr);
  while (bbiter__._16_8_ != 0) {
    simplify_loads(C,(basic_block *)bbiter__._16_8_);
    bbiter__._16_8_ = ptrlist_iter_prev((ptr_list_iter *)&bbiter___1.__nr);
  }
  ptrlist_reverse_iterator((ptr_list_iter *)local_50,(ptr_list *)ep->bbs);
  bbiter__._16_8_ = ptrlist_iter_prev((ptr_list_iter *)local_50);
  while (bbiter__._16_8_ != 0) {
    kill_dominated_stores(C,(basic_block *)bbiter__._16_8_);
    bbiter__._16_8_ = ptrlist_iter_prev((ptr_list_iter *)local_50);
  }
  return;
}

Assistant:

void dmrC_simplify_memops(struct dmr_C *C, struct entrypoint *ep)
{
	struct basic_block *bb;

	FOR_EACH_PTR_REVERSE(ep->bbs, bb) {
		simplify_loads(C, bb);
	} END_FOR_EACH_PTR_REVERSE(bb);

	FOR_EACH_PTR_REVERSE(ep->bbs, bb) {
		kill_dominated_stores(C, bb);
	} END_FOR_EACH_PTR_REVERSE(bb);
}